

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,uint8 *target,
          EpsCopyOutputStream *stream)

{
  ushort uVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  KeyValue *pKVar7;
  KeyValue *pKVar8;
  ulong uVar3;
  
  pKVar7 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    uVar3 = (ulong)uVar1;
    pKVar8 = pKVar7 + uVar1;
    if (uVar1 != 0) {
      do {
        uVar2 = uVar3 >> 1;
        uVar4 = uVar2;
        if (pKVar7[uVar2].first < start_field_number) {
          uVar4 = ~uVar2 + uVar3;
          pKVar7 = pKVar7 + uVar2 + 1;
        }
        uVar3 = uVar4;
      } while (0 < (long)uVar4);
    }
    for (; (pKVar7 != pKVar8 && (pKVar7->first < end_field_number)); pKVar7 = pKVar7 + 1) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         (&pKVar7->second,pKVar7->first,target,stream);
    }
  }
  else {
    p_Var5 = *(_Rb_tree_node_base **)&(pKVar7->second).type;
    if (p_Var5 != (_Rb_tree_node_base *)0x0) {
      p_Var6 = (_Rb_tree_node_base *)&pKVar7->second;
      do {
        if (start_field_number <= (int)p_Var5[1]._M_color) {
          p_Var6 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < start_field_number];
      } while (p_Var5 != (_Base_ptr)0x0);
      for (; (p_Var6 != (_Rb_tree_node_base *)&pKVar7->second &&
             ((int)p_Var6[1]._M_color < end_field_number));
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        target = Extension::InternalSerializeFieldWithCachedSizesToArray
                           ((Extension *)&p_Var6[1]._M_parent,p_Var6[1]._M_color,target,stream);
      }
    }
  }
  return target;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number, uint8* target,
    io::EpsCopyOutputStream* stream) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    const auto& end = map_.large->end();
    for (auto it = map_.large->lower_bound(start_field_number);
         it != end && it->first < end_field_number; ++it) {
      target = it->second.InternalSerializeFieldWithCachedSizesToArray(
          it->first, target, stream);
    }
    return target;
  }
  const KeyValue* end = flat_end();
  for (const KeyValue* it = std::lower_bound(
           flat_begin(), end, start_field_number, KeyValue::FirstComparator());
       it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        it->first, target, stream);
  }
  return target;
}